

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_c7e9::BlockCopy<sptk::uint24_t>::Run
          (BlockCopy<sptk::uint24_t> *this,istream *input_stream)

{
  int iVar1;
  _Setprecision _Var2;
  int iVar3;
  int *piVar4;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> *sequence_to_read;
  long lVar5;
  ulong uVar6;
  ostream *poVar7;
  istream *input_stream_00;
  istream *in_RSI;
  long in_RDI;
  unkbyte10 in_ST0;
  unkbyte10 Var8;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 in_ST7;
  int i_3;
  int i_2;
  int i_1;
  invalid_argument *anon_var_0;
  string word;
  int i;
  bool halt;
  uint24_t *inputs;
  uint24_t *pads;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> input_data;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> pad_data;
  int right_pad_length;
  int left_pad_length;
  int copy_length;
  size_t *in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb2;
  undefined2 in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffeba;
  undefined4 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec4;
  undefined1 in_stack_fffffffffffffec5;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  size_type in_stack_fffffffffffffec8;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined6 in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef6;
  undefined8 in_stack_fffffffffffffef8;
  string *this_00;
  undefined1 *puVar9;
  int in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int local_c8;
  int local_c4;
  int *in_stack_ffffffffffffff40;
  uint24_t local_b7;
  int local_b4;
  string local_b0 [32];
  int local_90;
  byte local_89;
  reference local_88;
  reference local_80;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> local_70;
  undefined1 local_41;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> local_40;
  int local_24;
  int local_20;
  int local_1c;
  istream *local_18;
  byte local_1;
  
  local_1c = (*(int *)(in_RDI + 0xc) - *(int *)(in_RDI + 8)) + 1;
  local_20 = *(int *)(in_RDI + 0x14);
  local_24 = (*(int *)(in_RDI + 0x18) - *(int *)(in_RDI + 0x14)) - local_1c;
  local_18 = in_RSI;
  piVar4 = std::max<int>(&local_20,&local_24);
  input_stream_00 = (istream *)(long)*piVar4;
  sequence_to_read = (vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> *)(in_RDI + 0x1c);
  puVar9 = &local_41;
  std::allocator<sptk::uint24_t>::allocator((allocator<sptk::uint24_t> *)0x10c30a);
  std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (value_type *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,
                               CONCAT15(in_stack_fffffffffffffec5,
                                        CONCAT14(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0
                                                )))),
             (allocator_type *)CONCAT62(in_stack_fffffffffffffeba,in_stack_fffffffffffffeb8));
  std::allocator<sptk::uint24_t>::~allocator((allocator<sptk::uint24_t> *)0x10c338);
  lVar5 = (long)*(int *)(in_RDI + 0x10);
  std::allocator<sptk::uint24_t>::allocator((allocator<sptk::uint24_t> *)0x10c358);
  std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (allocator_type *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,
                               CONCAT15(in_stack_fffffffffffffec5,
                                        CONCAT14(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0
                                                )))));
  std::allocator<sptk::uint24_t>::~allocator((allocator<sptk::uint24_t> *)0x10c37e);
  if ((*(byte *)(in_RDI + 0x1f) & 1) == 0) {
    do {
      in_stack_fffffffffffffec7 =
           sptk::ReadStream<sptk::uint24_t>
                     (SUB41((uint)in_stack_ffffffffffffff34 >> 0x10,0),in_stack_ffffffffffffff30,
                      (int)((ulong)puVar9 >> 0x20),(int)puVar9,sequence_to_read,input_stream_00,
                      in_stack_ffffffffffffff40);
      if (!(bool)in_stack_fffffffffffffec7) goto LAB_0010c92d;
      if ((0 < local_20) &&
         (in_stack_fffffffffffffec6 =
               sptk::WriteStream<sptk::uint24_t>
                         ((int)lVar5,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                          (vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> *)
                          CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),
                          (ostream *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                          in_stack_fffffffffffffee0), !(bool)in_stack_fffffffffffffec6)) {
        local_1 = 0;
        local_b4 = 1;
        goto LAB_0010c940;
      }
      in_stack_fffffffffffffec5 =
           sptk::WriteStream<sptk::uint24_t>
                     ((int)lVar5,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                      (vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> *)
                      CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),
                      (ostream *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                      in_stack_fffffffffffffee0);
      if (!(bool)in_stack_fffffffffffffec5) {
        local_1 = 0;
        local_b4 = 1;
        goto LAB_0010c940;
      }
    } while ((local_24 < 1) ||
            (in_stack_fffffffffffffec4 =
                  sptk::WriteStream<sptk::uint24_t>
                            ((int)lVar5,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                             (vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> *)
                             CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),
                             (ostream *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                             in_stack_fffffffffffffee0), (bool)in_stack_fffffffffffffec4));
    local_1 = 0;
    local_b4 = 1;
  }
  else {
    local_80 = std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::operator[](&local_40,0)
    ;
    local_88 = std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::operator[](&local_70,0)
    ;
    local_89 = 0;
    while (((local_89 ^ 0xff) & 1) != 0) {
      for (local_90 = 0; local_90 < *(int *)(in_RDI + 0x10); local_90 = local_90 + 1) {
        this_00 = local_b0;
        std::__cxx11::string::string(this_00);
        std::operator>>(local_18,this_00);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          Var8 = in_ST0;
          if ((*(int *)(in_RDI + 8) <= local_90) && (local_90 <= *(int *)(in_RDI + 0xc))) {
            Var8 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = in_ST6;
            in_ST6 = in_ST7;
            std::__cxx11::stold((string *)
                                CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                                in_stack_fffffffffffffea8);
            in_stack_fffffffffffffea8 = (size_t *)in_ST0;
            in_stack_fffffffffffffeb0 = (undefined2)((unkuint10)in_ST0 >> 0x40);
            in_ST7 = in_ST6;
            sptk::uint24_t::uint24_t<long_double>
                      ((uint24_t *)
                       CONCAT17(in_stack_fffffffffffffec7,
                                CONCAT16(in_stack_fffffffffffffec6,
                                         CONCAT15(in_stack_fffffffffffffec5,
                                                  CONCAT14(in_stack_fffffffffffffec4,
                                                           in_stack_fffffffffffffec0)))),
                       (longdouble)
                       CONCAT28(in_stack_fffffffffffffeb8,
                                CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0)));
            sptk::uint24_t::operator=(local_88 + local_90,&local_b7);
            sptk::uint24_t::~uint24_t(&local_b7);
          }
          local_b4 = 0;
          in_ST0 = Var8;
        }
        else {
          local_89 = 1;
          local_b4 = 4;
        }
        std::__cxx11::string::~string(local_b0);
        if (local_b4 != 0) {
          if (local_b4 != 4) goto LAB_0010c940;
          break;
        }
      }
      if ((local_89 & 1) != 0) break;
      for (local_c4 = 0; local_c4 < local_20; local_c4 = local_c4 + 1) {
        iVar1 = sptk::uint24_t::operator_cast_to_int(local_80 + local_c4);
        poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar1);
        std::operator<<(poVar7," ");
      }
      for (local_c8 = *(int *)(in_RDI + 8); local_c8 <= *(int *)(in_RDI + 0xc);
          local_c8 = local_c8 + 1) {
        _Var2 = std::setprecision(0x13);
        poVar7 = std::operator<<((ostream *)&std::cout,_Var2);
        iVar1 = sptk::uint24_t::operator_cast_to_int(local_88 + local_c8);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar1);
        std::operator<<(poVar7," ");
      }
      for (iVar1 = 0; iVar1 < local_24; iVar1 = iVar1 + 1) {
        iVar3 = sptk::uint24_t::operator_cast_to_int(local_80 + iVar1);
        poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
        std::operator<<(poVar7," ");
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
LAB_0010c92d:
    local_1 = 1;
    local_b4 = 1;
  }
LAB_0010c940:
  std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::~vector
            ((vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,
                               CONCAT15(in_stack_fffffffffffffec5,
                                        CONCAT14(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0
                                                )))));
  std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::~vector
            ((vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,
                               CONCAT15(in_stack_fffffffffffffec5,
                                        CONCAT14(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0
                                                )))));
  return (bool)(local_1 & 1);
}

Assistant:

bool Run(std::istream* input_stream) const override {
    const int copy_length(input_end_number_ - input_start_number_ + 1);
    const int left_pad_length(output_start_number_);
    const int right_pad_length(output_block_length_ - output_start_number_ -
                               copy_length);

    std::vector<T> pad_data(std::max(left_pad_length, right_pad_length),
                            pad_value_);
    std::vector<T> input_data(input_block_length_);

    if (is_ascii_) {
      T* pads(&(pad_data[0]));
      T* inputs(&(input_data[0]));
      bool halt(false);
      while (!halt) {
        // Read data.
        for (int i(0); i < input_block_length_; ++i) {
          std::string word;
          *input_stream >> word;
          if (word.empty()) {
            halt = true;
            break;
          }
          if (input_start_number_ <= i && i <= input_end_number_) {
            try {
              inputs[i] = static_cast<T>(std::stold(word));
            } catch (std::invalid_argument&) {
              return false;
            }
          }
        }
        if (halt) break;

        // Write data.
        for (int i(0); i < left_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        for (int i(input_start_number_); i <= input_end_number_; ++i) {
          std::cout << std::setprecision(
                           std::numeric_limits<long double>::digits10 + 1)
                    << inputs[i] << " ";
        }
        for (int i(0); i < right_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        std::cout << std::endl;
      }
    } else {
      while (sptk::ReadStream(false, 0, 0, input_block_length_, &input_data,
                              input_stream, NULL)) {
        if (0 < left_pad_length &&
            !sptk::WriteStream(0, left_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
        if (!sptk::WriteStream(input_start_number_, copy_length, input_data,
                               &std::cout, NULL)) {
          return false;
        }
        if (0 < right_pad_length &&
            !sptk::WriteStream(0, right_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
      }
    }

    return true;
  }